

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Index __thiscall wasm::Builder::addParam(Builder *this,Function *func,Name name,Type type)

{
  Index IVar1;
  Module *pMVar2;
  Module *pMVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  Iterator __first;
  Signature SVar6;
  Iterator __last;
  undefined1 local_78 [8];
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Name name_local;
  Type type_local;
  HeapType local_30;
  Index index;
  
  name_local.super_IString.str._M_str = name.super_IString.str._M_str;
  pMVar2 = this[0x17].wasm;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)func;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  SVar6 = HeapType::getSignature((HeapType *)(this + 7));
  sig.results = SVar6.params.id;
  pMVar3 = (Module *)wasm::Type::size(&sig.results);
  if (pMVar2 != pMVar3) {
    __assert_fail("func->localIndices.size() == func->getParams().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x523,"static Index wasm::Builder::addParam(Function *, Name, Type)");
  }
  if (name.super_IString.str._M_len != 0) {
    _local_78 = HeapType::getSignature((HeapType *)(this + 7));
    __last = wasm::Type::end((Type *)local_78);
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)local_78;
    std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,__first,__last,
               (allocator_type *)&local_30);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&sig.results,
               (value_type *)&name_local.super_IString.str._M_str);
    wasm::Type::Type(&type_local,(Tuple *)&sig.results);
    SVar6.results.id = sig.params.id;
    SVar6.params.id = type_local.id;
    HeapType::HeapType(&local_30,SVar6);
    this[7].wasm = (Module *)CONCAT44(local_30.id._4_4_,(Index)local_30.id);
    IVar1 = *(Index *)&this[0x10].wasm;
    local_30.id._0_4_ = IVar1;
    pmVar4 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(this + 0x14),
                          (key_type *)
                          &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    *pmVar4 = IVar1;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(this + 0xd),(key_type *)&local_30);
    IVar1 = (Index)local_30.id;
    (pmVar5->super_IString).str._M_len =
         (size_t)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (pmVar5->super_IString).str._M_str = (char *)name_local.super_IString.str._M_len;
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&sig.results);
    return IVar1;
  }
  __assert_fail("name.is()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x524,"static Index wasm::Builder::addParam(Function *, Name, Type)");
}

Assistant:

static Index addParam(Function* func, Name name, Type type) {
    // only ok to add a param if no vars, otherwise indices are invalidated
    assert(func->localIndices.size() == func->getParams().size());
    assert(name.is());
    Signature sig = func->getSig();
    std::vector<Type> params(sig.params.begin(), sig.params.end());
    params.push_back(type);
    func->type = Signature(Type(params), sig.results);
    Index index = func->localNames.size();
    func->localIndices[name] = index;
    func->localNames[index] = name;
    return index;
  }